

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

int __thiscall
Validate::CheckIDDoesNotExceedMaxLimit(Validate *this,char *idName,longlong initialID)

{
  int iVar1;
  long in_RAX;
  long extraout_RDX;
  
  if ((initialID < 0x80000000) && (in_RAX = (long)this->MIN_ID_, in_RAX <= initialID)) {
    return (int)initialID;
  }
  CheckIDDoesNotExceedMaxLimit();
  if (0xffffffff00000000 < extraout_RDX - 0x100000000U) {
    return (int)extraout_RDX;
  }
  CheckIDDoesNotExceedMaxLimit();
  iVar1 = __isoc99_sscanf(this->line_ + 8,"%lld,%d,%d,%f",this[1].line_ + 0x24,this[1].line_ + 0xf,
                          this[1].line_ + 0x13,this[1].line_ + 0x17,in_RAX);
  return iVar1;
}

Assistant:

int Validate::CheckIDDoesNotExceedMaxLimit(char *idName, long long initialID) {
/* Check ID does not exceed maximum value for integers. */

  if (initialID < MIN_ID_ || initialID > INT_MAX) {

    fprintf(stderr, "ERROR: %s ID %lld on line %d does not lie within"
		    " permitted range [%d, %d]. Please reassign %s IDs to lie"
		    " within this range.\n",
		    idName, initialID, lineno_, MIN_ID_, INT_MAX, idName);
    PrintErrorMessage();

  }

  return (int)initialID;

}